

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O0

void Assimp::STEP::ReadFile
               (DB *db,ConversionSchema *scheme,char **types_to_track,size_t len,
               char **inverse_indices_to_track,size_t len2)

{
  bool bVar1;
  ObjectMap *this;
  LineSplitter *this_00;
  line_idx lVar2;
  long lVar3;
  char *pcVar4;
  uint64_t uVar5;
  ulong uVar6;
  LazyObject *this_01;
  Logger *pLVar7;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar8;
  RefMap *this_02;
  basic_formatter *pbVar9;
  bool local_87b;
  size_type local_798;
  size_type local_790;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  string local_610;
  char *local_5f0;
  char *copysz;
  size_type szLen;
  char *sz;
  char *local_5d0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c0;
  undefined1 local_5b8 [8];
  string type;
  size_type ne;
  size_type ns;
  string local_580;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string local_3e8;
  string local_3c8;
  _Self local_3a8;
  _Self local_3a0;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  string local_348;
  string local_328;
  string *local_308;
  string *snext_1;
  ulong uStack_2f8;
  bool ok_1;
  size_type n2;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  string local_2a0;
  string local_280;
  string *local_260;
  string *snext;
  ulong uStack_250;
  bool ok;
  size_type n1;
  string local_240;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  string local_1d8 [32];
  uint64_t local_1b8;
  uint64_t id;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  long local_140;
  size_type n0;
  string local_130;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  uint64_t local_c8;
  uint64_t line;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined8 local_b0;
  char local_a1;
  char *local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_70 [8];
  string s;
  bool has_next;
  LineSplitter *splitter;
  ObjectMap *map;
  size_t len2_local;
  char **inverse_indices_to_track_local;
  size_t len_local;
  char **types_to_track_local;
  ConversionSchema *scheme_local;
  DB *db_local;
  
  DB::SetSchema(db,scheme);
  DB::SetTypesToTrack(db,types_to_track,len);
  DB::SetInverseIndicesToTrack(db,inverse_indices_to_track,len2);
  this = DB::GetObjects(db);
  this_00 = DB::GetSplitter(db);
  do {
    bVar1 = LineSplitter::operator_cast_to_bool(this_00);
    if (!bVar1) break;
    s.field_2._M_local_buf[0xf] = '\0';
    LineSplitter::operator*[abi_cxx11_((string *)local_70,this_00);
    bVar1 = std::operator==((string *)local_70,"ENDSEC;");
    if (bVar1) {
      local_80 = 3;
    }
    else {
      local_98._M_current = (char *)std::__cxx11::string::begin();
      local_a0 = (char *)std::__cxx11::string::end();
      local_a1 = ' ';
      local_90 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                           (local_98,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_a0,&local_a1);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_88,&local_90);
      local_b8._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_b0,&local_b8);
      line = std::__cxx11::string::erase(local_70,local_88,local_b0);
      lVar2 = LineSplitter::get_index(this_00);
      local_c8 = lVar2 + 1;
      lVar3 = std::__cxx11::string::length();
      if (lVar3 == 0) {
        __assert_fail("s.length()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/STEPParser/STEPFileReader.cpp"
                      ,0xc0,
                      "void Assimp::STEP::ReadFile(DB &, const EXPRESS::ConversionSchema &, const char *const *, size_t, const char *const *, size_t)"
                     );
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_70);
      if (*pcVar4 == '#') {
        local_140 = std::__cxx11::string::find_first_of((char)local_70,0x3d);
        if (local_140 == -1) {
          pLVar7 = DefaultLogger::get();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,"expected token \'=\'",&local_181);
          uVar5 = local_c8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a8,"",(allocator<char> *)((long)&id + 7));
          AddLineNumber(&local_160,&local_180,uVar5,&local_1a8);
          Logger::warn(pLVar7,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&id + 7));
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator(&local_181);
          LineSplitter::operator++(this_00);
          local_80 = 2;
        }
        else {
          std::__cxx11::string::substr((ulong)local_1d8,(ulong)local_70);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          uVar5 = strtoul10_64(pcVar4,(char **)0x0,(uint *)0x0);
          std::__cxx11::string::~string(local_1d8);
          local_1b8 = uVar5;
          if (uVar5 == 0) {
            pLVar7 = DefaultLogger::get();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_218,"expected positive, numeric entity id",&local_219);
            uVar5 = local_c8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_240,"",(allocator<char> *)((long)&n1 + 7));
            AddLineNumber(&local_1f8,&local_218,uVar5,&local_240);
            Logger::warn(pLVar7,&local_1f8);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_240);
            std::allocator<char>::~allocator((allocator<char> *)((long)&n1 + 7));
            std::__cxx11::string::~string((string *)&local_218);
            std::allocator<char>::~allocator(&local_219);
            LineSplitter::operator++(this_00);
            local_80 = 2;
          }
          else {
            uStack_250 = std::__cxx11::string::find_first_of((char)local_70,0x28);
            if (uStack_250 == 0xffffffffffffffff) {
              s.field_2._M_local_buf[0xf] = '\x01';
              snext._7_1_ = 0;
              LineSplitter::operator++(this_00);
              while (bVar1 = LineSplitter::operator_cast_to_bool(this_00), bVar1) {
                LineSplitter::operator*[abi_cxx11_(&local_280,this_00);
                local_260 = &local_280;
                uVar6 = std::__cxx11::string::empty();
                if ((uVar6 & 1) == 0) {
                  bVar1 = anon_unknown.dwarf_144e9a7::IsEntityDef(local_260);
                  if (bVar1) {
                    local_80 = 4;
                  }
                  else {
                    std::__cxx11::string::append((string *)local_70);
                    uStack_250 = std::__cxx11::string::find_first_of((char)local_70,0x28);
                    snext._7_1_ = uStack_250 != 0xffffffffffffffff;
                    local_80 = 0;
                  }
                }
                else {
                  local_80 = 6;
                }
                std::__cxx11::string::~string((string *)&local_280);
                if ((local_80 != 0) && (local_80 == 4)) break;
                LineSplitter::operator++(this_00);
              }
              if ((snext._7_1_ & 1) == 0) {
                pLVar7 = DefaultLogger::get();
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2c0,"expected token \'(\'",&local_2c1);
                uVar5 = local_c8;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2e8,"",(allocator<char> *)((long)&n2 + 7));
                AddLineNumber(&local_2a0,&local_2c0,uVar5,&local_2e8);
                Logger::warn(pLVar7,&local_2a0);
                std::__cxx11::string::~string((string *)&local_2a0);
                std::__cxx11::string::~string((string *)&local_2e8);
                std::allocator<char>::~allocator((allocator<char> *)((long)&n2 + 7));
                std::__cxx11::string::~string((string *)&local_2c0);
                std::allocator<char>::~allocator(&local_2c1);
                local_80 = 2;
                goto LAB_00c09696;
              }
            }
            uVar6 = std::__cxx11::string::find_last_of((char)local_70,0x29);
            uStack_2f8 = uVar6;
            if ((((uVar6 == 0xffffffffffffffff) || (uVar6 < uStack_250)) ||
                (lVar3 = std::__cxx11::string::length(), uVar6 == lVar3 - 1U)) ||
               (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_70), *pcVar4 != ';'))
            {
              s.field_2._M_local_buf[0xf] = '\x01';
              snext_1._7_1_ = 0;
              LineSplitter::operator++(this_00);
              while (bVar1 = LineSplitter::operator_cast_to_bool(this_00), bVar1) {
                LineSplitter::operator*[abi_cxx11_(&local_328,this_00);
                local_308 = &local_328;
                uVar6 = std::__cxx11::string::empty();
                if ((uVar6 & 1) == 0) {
                  bVar1 = anon_unknown.dwarf_144e9a7::IsEntityDef(local_308);
                  if (bVar1) {
                    local_80 = 7;
                  }
                  else {
                    std::__cxx11::string::append((string *)local_70);
                    uVar6 = std::__cxx11::string::find_last_of((char)local_70,0x29);
                    local_87b = true;
                    uStack_2f8 = uVar6;
                    if ((uVar6 != 0xffffffffffffffff) && (local_87b = true, uStack_250 <= uVar6)) {
                      lVar3 = std::__cxx11::string::length();
                      local_87b = true;
                      if (uVar6 != lVar3 - 1U) {
                        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_70);
                        local_87b = *pcVar4 != ';';
                      }
                    }
                    snext_1._7_1_ = (local_87b ^ 0xffU) & 1;
                    local_80 = 0;
                  }
                }
                else {
                  local_80 = 9;
                }
                std::__cxx11::string::~string((string *)&local_328);
                if ((local_80 != 0) && (local_80 == 7)) break;
                LineSplitter::operator++(this_00);
              }
              if ((snext_1._7_1_ & 1) == 0) {
                pLVar7 = DefaultLogger::get();
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_368,"expected token \')\'",&local_369);
                uVar5 = local_c8;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_390,"",&local_391);
                AddLineNumber(&local_348,&local_368,uVar5,&local_390);
                Logger::warn(pLVar7,&local_348);
                std::__cxx11::string::~string((string *)&local_348);
                std::__cxx11::string::~string((string *)&local_390);
                std::allocator<char>::~allocator(&local_391);
                std::__cxx11::string::~string((string *)&local_368);
                std::allocator<char>::~allocator(&local_369);
                local_80 = 2;
                goto LAB_00c09696;
              }
            }
            local_3a0._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_const_Assimp::STEP::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
                 ::find(this,&local_1b8);
            local_3a8._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_const_Assimp::STEP::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
                 ::end(this);
            bVar1 = std::operator!=(&local_3a0,&local_3a8);
            if (bVar1) {
              pLVar7 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter(&local_560);
              pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                       ::operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                    *)&local_560,(char (*) [24])"an object with the id #");
              pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                       ::operator_(pbVar8,&local_1b8);
              pbVar9 = (basic_formatter *)
                       Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                       ::operator_(pbVar8,(char (*) [16])" already exists");
              Formatter::basic_formatter::operator_cast_to_string(&local_3e8,pbVar9);
              uVar5 = local_c8;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_580,"",(allocator<char> *)((long)&ns + 7));
              AddLineNumber(&local_3c8,&local_3e8,uVar5,&local_580);
              Logger::warn(pLVar7,&local_3c8);
              std::__cxx11::string::~string((string *)&local_3c8);
              std::__cxx11::string::~string((string *)&local_580);
              std::allocator<char>::~allocator((allocator<char> *)((long)&ns + 7));
              std::__cxx11::string::~string((string *)&local_3e8);
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              ~basic_formatter(&local_560);
            }
            do {
              pcVar4 = (char *)std::__cxx11::string::at((ulong)local_70);
              bVar1 = IsSpace<char>(*pcVar4);
            } while (bVar1);
            type.field_2._8_8_ = uStack_250;
            do {
              type.field_2._8_8_ = type.field_2._8_8_ + -1;
              pcVar4 = (char *)std::__cxx11::string::at((ulong)local_70);
              bVar1 = IsSpace<char>(*pcVar4);
            } while (bVar1);
            std::__cxx11::string::substr((ulong)local_5b8,(ulong)local_70);
            local_5c0._M_current = (char *)std::__cxx11::string::begin();
            local_5c8._M_current = (char *)std::__cxx11::string::end();
            local_5d0 = (char *)std::__cxx11::string::begin();
            sz = (char *)std::
                         transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                                   (local_5c0,local_5c8,
                                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_5d0,ToLower<char>);
            szLen = (size_type)
                    EXPRESS::ConversionSchema::GetStaticStringForToken(scheme,(string *)local_5b8);
            if ((char *)szLen != (char *)0x0) {
              copysz = (char *)((uStack_2f8 - uStack_250) + 1);
              local_5f0 = (char *)operator_new__((uStack_2f8 - uStack_250) + 2);
              lVar3 = std::__cxx11::string::c_str();
              pcVar4 = (char *)(lVar3 + uStack_250);
              lVar3 = std::__cxx11::string::c_str();
              std::copy<char_const*,char*>(pcVar4,(char *)(lVar3 + 1 + uStack_2f8),local_5f0);
              local_5f0[(long)copysz] = '\0';
              this_01 = (LazyObject *)operator_new(0x28);
              LazyObject::LazyObject(this_01,db,local_1b8,local_c8,(char *)szLen,local_5f0);
              DB::InternInsert(db,this_01);
            }
            if ((s.field_2._M_local_buf[0xf] & 1U) == 0) {
              LineSplitter::operator++(this_00);
            }
            std::__cxx11::string::~string((string *)local_5b8);
            local_80 = 0;
          }
        }
      }
      else {
        pLVar7 = DefaultLogger::get();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"expected token \'#\'",&local_109);
        uVar5 = local_c8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"",(allocator<char> *)((long)&n0 + 7));
        AddLineNumber(&local_e8,&local_108,uVar5,&local_130);
        Logger::warn(pLVar7,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator((allocator<char> *)((long)&n0 + 7));
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
        LineSplitter::operator++(this_00);
        local_80 = 2;
      }
    }
LAB_00c09696:
    std::__cxx11::string::~string((string *)local_70);
  } while ((local_80 == 0) || (local_80 == 2));
  bVar1 = LineSplitter::operator_cast_to_bool(this_00);
  if (!bVar1) {
    pLVar7 = DefaultLogger::get();
    Logger::warn(pLVar7,"STEP: ignoring unexpected EOF");
  }
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_788);
    pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_788,(char (*) [11])"STEP: got ");
    local_790 = std::
                map<unsigned_long,_const_Assimp::STEP::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
                ::size(this);
    pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar8,&local_790);
    pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar8,(char (*) [22])" object records with ");
    this_02 = DB::GetRefs(db);
    local_798 = std::
                multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::size(this_02);
    pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar8,&local_798);
    pbVar9 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar8,(char (*) [23])" inverse index entries");
    Formatter::basic_formatter::operator_cast_to_string(&local_610,pbVar9);
    Logger::debug(pLVar7,&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_788);
  }
  return;
}

Assistant:

void STEP::ReadFile(DB& db,const EXPRESS::ConversionSchema& scheme,
    const char* const* types_to_track, size_t len,
    const char* const* inverse_indices_to_track, size_t len2)
{
    db.SetSchema(scheme);
    db.SetTypesToTrack(types_to_track,len);
    db.SetInverseIndicesToTrack(inverse_indices_to_track,len2);

    const DB::ObjectMap& map = db.GetObjects();
    LineSplitter& splitter = db.GetSplitter();

    while (splitter) {
        bool has_next = false;
        std::string s = *splitter;
        if (s == "ENDSEC;") {
            break;
        }
        s.erase(std::remove(s.begin(), s.end(), ' '), s.end());

        // want one-based line numbers for human readers, so +1
        const uint64_t line = splitter.get_index()+1;
        // LineSplitter already ignores empty lines
        ai_assert(s.length());
        if (s[0] != '#') {
            ASSIMP_LOG_WARN(AddLineNumber("expected token \'#\'",line));
            ++splitter;
            continue;
        }
        // ---
        // extract id, entity class name and argument string,
        // but don't create the actual object yet.
        // ---
        const std::string::size_type n0 = s.find_first_of('=');
        if (n0 == std::string::npos) {
            ASSIMP_LOG_WARN(AddLineNumber("expected token \'=\'",line));
            ++splitter;
            continue;
        }

        const uint64_t id = strtoul10_64(s.substr(1,n0-1).c_str());
        if (!id) {
            ASSIMP_LOG_WARN(AddLineNumber("expected positive, numeric entity id",line));
            ++splitter;
            continue;
        }
        std::string::size_type n1 = s.find_first_of('(',n0);
        if (n1 == std::string::npos) {
            has_next = true;
            bool ok = false;
            for( ++splitter; splitter; ++splitter) {
                const std::string& snext = *splitter;
                if (snext.empty()) {
                    continue;
                }

                // the next line doesn't start an entity, so maybe it is
                // just a continuation  for this line, keep going
                if (!IsEntityDef(snext)) {
                    s.append(snext);
                    n1 = s.find_first_of('(',n0);
                    ok = (n1 != std::string::npos);
                }
                else {
                    break;
                }
            }

            if(!ok) {
                ASSIMP_LOG_WARN(AddLineNumber("expected token \'(\'",line));
                continue;
            }
        }

        std::string::size_type n2 = s.find_last_of(')');
        if (n2 == std::string::npos || n2 < n1 || n2 == s.length() - 1 || s[n2 + 1] != ';') {
            has_next = true;
            bool ok = false;
            for( ++splitter; splitter; ++splitter) {
                const std::string& snext = *splitter;
                if (snext.empty()) {
                    continue;
                }

                // the next line doesn't start an entity, so maybe it is
                // just a continuation  for this line, keep going
                if (!IsEntityDef(snext)) {
                    s.append(snext);
                    n2 = s.find_last_of(')');
                    ok = !(n2 == std::string::npos || n2 < n1 || n2 == s.length() - 1 || s[n2 + 1] != ';');
                } else {
                    break;
                }
            }
            if(!ok) {
                ASSIMP_LOG_WARN(AddLineNumber("expected token \')\'",line));
                continue;
            }
        }

        if (map.find(id) != map.end()) {
            ASSIMP_LOG_WARN(AddLineNumber((Formatter::format(),"an object with the id #",id," already exists"),line));
        }

        std::string::size_type ns = n0;
        do ++ns; while( IsSpace(s.at(ns)));
        std::string::size_type ne = n1;
        do --ne; while( IsSpace(s.at(ne)));
        std::string type = s.substr(ns,ne-ns+1);
        std::transform( type.begin(), type.end(), type.begin(), &Assimp::ToLower<char>  );
        const char* sz = scheme.GetStaticStringForToken(type);
        if(sz) {
            const std::string::size_type szLen = n2-n1+1;
            char* const copysz = new char[szLen+1];
            std::copy(s.c_str()+n1,s.c_str()+n2+1,copysz);
            copysz[szLen] = '\0';
            db.InternInsert(new LazyObject(db,id,line,sz,copysz));
        }
        if(!has_next) {
            ++splitter;
        }
    }

    if (!splitter) {
        ASSIMP_LOG_WARN("STEP: ignoring unexpected EOF");
    }

    if ( !DefaultLogger::isNullLogger()){
        ASSIMP_LOG_DEBUG((Formatter::format(),"STEP: got ",map.size()," object records with ",
            db.GetRefs().size()," inverse index entries"));
    }
}